

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadresource.cpp
# Opt level: O2

load_gameboard_status_t *
Game::Loader::load_GameBoard_data_from_file
          (load_gameboard_status_t *__return_storage_ptr__,string *filename)

{
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  istreambuf_iterator<char,_std::char_traits<char>_> __last;
  int iVar1;
  int iVar2;
  difference_type dVar3;
  istream *piVar4;
  ostream *poVar5;
  uint uVar6;
  pointer pbVar7;
  int iVar8;
  uint uVar9;
  undefined8 in_stack_fffffffffffffab8;
  int iVar10;
  _Iter_equals_val<const_char> in_stack_fffffffffffffac0;
  ulong uVar11;
  string tempLine;
  value_type local_518;
  vector<Game::tile_t,_std::allocator<Game::tile_t>_> processed_tile_data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4c0;
  tile_t local_4a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_tile_data;
  _Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_> local_480;
  string local_468 [32];
  ifstream stateFile_1;
  ifstream stateFile;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&stateFile,(string *)filename,_S_in);
  if ((abStack_218[*(long *)(_stateFile + -0x18)] & 5) == 0) {
    std::__cxx11::string::string(local_468,(string *)filename);
    std::ifstream::ifstream(&stateFile_1,local_468,_S_in);
    tempLine._M_dataplus._M_p._0_1_ = 10;
    uVar9 = 0;
    __first._8_8_ = in_stack_fffffffffffffab8;
    __first._M_sbuf = (streambuf_type *)0x1089ab;
    __last._M_sbuf._1_7_ = tempLine._M_dataplus._M_p._1_7_;
    __last._M_sbuf._0_1_ = 10;
    __last._8_8_ = tempLine._M_string_length;
    dVar3 = std::
            __count_if<std::istreambuf_iterator<char,std::char_traits<char>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (__first,__last,in_stack_fffffffffffffac0);
    std::ifstream::~ifstream((istringstream *)&stateFile_1);
    std::__cxx11::string::~string(local_468);
    file_tile_data.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tempLine._M_dataplus._M_p._0_1_ = SUB81(&tempLine.field_2,0);
    tempLine._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&tempLine.field_2 >> 8);
    tempLine._M_string_length = 0;
    file_tile_data.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    file_tile_data.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tempLine.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&stateFile,(string *)&tempLine);
      if ((((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) || (9 < uVar9))
      break;
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&stateFile_1,(string *)&tempLine,_S_in);
      local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
      local_518._M_string_length = 0;
      local_518.field_2._M_local_buf[0] = '\0';
      uVar6 = 0;
      while( true ) {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&stateFile_1,(string *)&local_518,',');
        if ((((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) || (9 < uVar6))
        break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&file_tile_data,&local_518);
        uVar6 = uVar6 + 1;
      }
      std::__cxx11::string::~string((string *)&local_518);
      std::__cxx11::istringstream::~istringstream((istringstream *)&stateFile_1);
      uVar9 = uVar9 + 1;
    }
    std::__cxx11::string::~string((string *)&tempLine);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_4c0,&file_tile_data);
    processed_tile_data.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    processed_tile_data.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    processed_tile_data.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar11 = 0;
    for (pbVar7 = local_4c0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar7 != local_4c0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar7 = pbVar7 + 1) {
      std::__cxx11::string::string((string *)&local_518,(string *)pbVar7);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&stateFile_1,(string *)&local_518,_S_in);
      tempLine._M_dataplus._M_p._0_1_ = SUB81(&tempLine.field_2,0);
      tempLine._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&tempLine.field_2 >> 8);
      tempLine._M_string_length = 0;
      tempLine.field_2._M_local_buf[0] = '\0';
      iVar2 = 0;
      iVar1 = 0;
      iVar8 = 0;
      while( true ) {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&stateFile_1,(string *)&tempLine,':');
        iVar10 = (int)uVar11;
        if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
        if (iVar8 == 1) {
          iVar2 = std::__cxx11::stoi(&tempLine,(size_t *)0x0,10);
        }
        else if (iVar8 == 0) {
          iVar1 = std::__cxx11::stoi(&tempLine,(size_t *)0x0,10);
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cout,"ERROR: [tile_processed_counter: ");
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(int)uVar11);
          poVar5 = std::operator<<(poVar5,"]: Read past MAX_NO_TILE_IDXS! (idx no:");
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,2);
          std::operator<<(poVar5,")\n");
        }
        iVar8 = iVar8 + 1;
      }
      std::__cxx11::string::~string((string *)&tempLine);
      std::__cxx11::istringstream::~istringstream((istringstream *)&stateFile_1);
      local_4a8.blocked = iVar2 != 0;
      local_4a8.value = (long)iVar1;
      std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>::emplace_back<Game::tile_t>
                (&processed_tile_data,&local_4a8);
      uVar11 = (ulong)(iVar10 + 1);
      std::__cxx11::string::~string((string *)&local_518);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_4c0);
    tempLine._M_dataplus._M_p._0_1_ = 1;
    std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>::vector
              ((vector<Game::tile_t,_std::allocator<Game::tile_t>_> *)&local_480,
               &processed_tile_data);
    GameBoard::GameBoard((GameBoard *)&stateFile_1,(long)(int)dVar3,(tile_data_array_t *)&local_480)
    ;
    std::tuple<bool,_Game::GameBoard>::tuple<bool,_Game::GameBoard,_true>
              (__return_storage_ptr__,(bool *)&tempLine,(GameBoard *)&stateFile_1);
    std::_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>::~_Vector_base
              ((_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_> *)&stateFile_1);
    std::_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>::~_Vector_base(&local_480);
    std::_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>::~_Vector_base
              (&processed_tile_data.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>)
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&file_tile_data);
  }
  else {
    tempLine._M_dataplus._M_p._0_1_ = 0;
    _stateFile_1 = (pointer)0x0;
    std::tuple<bool,_Game::GameBoard>::tuple<bool,_Game::GameBoard,_true>
              (__return_storage_ptr__,(bool *)&tempLine,(GameBoard *)&stateFile_1);
    std::_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>::~_Vector_base
              ((_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_> *)&stateFile_1);
  }
  std::ifstream::~ifstream(&stateFile);
  return __return_storage_ptr__;
}

Assistant:

load_gameboard_status_t load_GameBoard_data_from_file(std::string filename) {
  std::ifstream stateFile(filename);
  if (stateFile) {
    const ull savedBoardPlaySize = GetLines(filename);
    const auto file_tile_data = get_file_tile_data(stateFile);
    const auto processed_tile_data =
        process_file_tile_string_data(file_tile_data);
    return std::make_tuple(true,
                           GameBoard(savedBoardPlaySize, processed_tile_data));
  }
  return std::make_tuple(false, GameBoard{});
}